

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void writelog(char *str)

{
  FILE *__stream;
  
  __stream = fopen("./log.txt","a");
  if (__stream != (FILE *)0x0) {
    fputs(str,__stream);
    fclose(__stream);
    return;
  }
  exit(1);
}

Assistant:

void writelog(char *str)
{
	FILE *log;
	char *LOG_FILE = "./log.txt";
	if ((log = fopen(LOG_FILE, "a")) == NULL)
	{
		exit(EXIT_FAILURE);
	}
	fputs(str, log);
	fclose(log);
}